

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEngineIterator::QAbstractFileEngineIterator
          (QAbstractFileEngineIterator *this,QString *path,Filters filters,QStringList *nameFilters)

{
  this->_vptr_QAbstractFileEngineIterator = (_func_int **)&PTR__QAbstractFileEngineIterator_00660c38
  ;
  QFileInfo::QFileInfo(&this->m_fileInfo);
  (this->m_filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (Int)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i;
  (this->m_listingFilters).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i = 0;
  QArrayDataPointer<QString>::QArrayDataPointer(&(this->m_nameFilters).d,&nameFilters->d);
  appendSlashIfNeeded(&this->m_path,path);
  return;
}

Assistant:

QAbstractFileEngineIterator::QAbstractFileEngineIterator(const QString &path, QDir::Filters filters,
                                                         const QStringList &nameFilters)
    : m_filters(filters),
      m_nameFilters(nameFilters),
      m_path(appendSlashIfNeeded(path))
{
}